

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O1

size_t g12sVerify_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = zzMod_deep(n,n);
  sVar2 = zzMulMod_deep(n);
  sVar3 = zzInvMod_deep(n);
  sVar4 = ecAddMulA_deep(n,ec_d,ec_deep,2,n,n);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return sVar1 + n * 0x38;
}

Assistant:

static size_t g12sVerify_deep(size_t n, size_t f_deep, size_t ec_d, 
	size_t ec_deep)
{
	const size_t m = n;
	return O_OF_W(5 * m + 2 * n) +
		utilMax(4,
			zzMod_deep(m, m),
			zzMulMod_deep(m),
			zzInvMod_deep(m),
			ecAddMulA_deep(n, ec_d, ec_deep, 2, m, m));
}